

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O1

bool __thiscall FConfigFile::WriteConfigFile(FConfigFile *this)

{
  FConfigSection *pFVar1;
  char *pcVar2;
  FILE *__stream;
  char *pcVar3;
  FConfigEntry *pFVar4;
  bool bVar5;
  
  if ((this->OkayToWrite != false) || (bVar5 = true, this->FileExisted == false)) {
    __stream = fopen((this->PathName).Chars,"w");
    bVar5 = __stream != (FILE *)0x0;
    if (bVar5) {
      (*this->_vptr_FConfigFile[2])(this,__stream);
      pFVar1 = this->Sections;
      while (pFVar1 != (FConfigSection *)0x0) {
        pFVar4 = pFVar1->RootEntry;
        pcVar2 = (pFVar1->Note).Chars;
        if (*(int *)(pcVar2 + -0xc) != 0) {
          fputs(pcVar2,__stream);
        }
        fprintf(__stream,"[%s]\n",(pFVar1->SectionName).Chars);
        for (; pFVar4 != (FConfigEntry *)0x0; pFVar4 = pFVar4->Next) {
          pcVar2 = pFVar4->Value;
          pcVar3 = strpbrk(pcVar2,"\r\n");
          if (pcVar3 == (char *)0x0) {
            fprintf(__stream,"%s=%s\n",pFVar4->Key,pcVar2);
          }
          else {
            GenerateEndTag(pcVar2);
            fprintf(__stream,"%s=<<<%s\n%s\n>>>%s\n",pFVar4->Key,GenerateEndTag::EndTag,
                    pFVar4->Value,GenerateEndTag::EndTag);
          }
        }
        pFVar1 = pFVar1->Next;
        fputs("\n",__stream);
      }
      fclose(__stream);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool FConfigFile::WriteConfigFile () const
{
	if (!OkayToWrite && FileExisted)
	{ // Pretend it was written anyway so that the user doesn't get
	  // any "config not written" notifications, but only if the file
	  // already existed. Otherwise, let it write out a default one.
		return true;
	}

	FILE *file = fopen (PathName, "w");
	FConfigSection *section;
	FConfigEntry *entry;

	if (file == NULL)
		return false;

	WriteCommentHeader (file);

	section = Sections;
	while (section != NULL)
	{
		entry = section->RootEntry;
		if (section->Note.IsNotEmpty())
		{
			fputs (section->Note.GetChars(), file);
		}
		fprintf (file, "[%s]\n", section->SectionName.GetChars());
		while (entry != NULL)
		{
			if (strpbrk(entry->Value, "\r\n") == NULL)
			{ // Single-line value
				fprintf (file, "%s=%s\n", entry->Key, entry->Value);
			}
			else
			{ // Multi-line value
				const char *endtag = GenerateEndTag(entry->Value);
				fprintf (file, "%s=<<<%s\n%s\n>>>%s\n", entry->Key,
					endtag, entry->Value, endtag);
			}
			entry = entry->Next;
		}
		section = section->Next;
		fputs ("\n", file);
	}
	fclose (file);
	return true;
}